

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

ostream * pstack::operator<<(ostream *os,JSON<pstack::Field<char[10],_unsigned_int>,_char> *o)

{
  ostream *poVar1;
  JSON<const_char_*,_char> local_38;
  char (*local_28) [10];
  char local_19;
  
  local_28 = o->object->k;
  local_38.context = &local_19;
  local_19 = '\0';
  local_38.object = (char **)&local_28;
  poVar1 = operator<<(os,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}